

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* ParseMountInfo(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *__return_storage_ptr__,
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>_>_>
                *subsystems)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long lVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  iterator iVar7;
  long lVar8;
  ulong uVar9;
  string opt;
  string newPath;
  string line;
  MountPoint mp;
  ifstream mountinfo;
  key_type local_388;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>_>_>
  *local_368;
  string local_360;
  string local_340;
  _Base_ptr local_320;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  MountPoint local_2d8;
  long local_238 [4];
  byte abStack_218 [488];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_368 = &subsystems->_M_t;
  std::ifstream::ifstream(local_238,"/proc/self/mountinfo",_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if ((cVar4 != '\0') && ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0)) {
    local_320 = &(((_Rep_type *)&local_368->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
    do {
      local_340._M_string_length = 0;
      local_340.field_2._M_local_buf[0] = '\0';
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_340,cVar4);
      memset(&local_2d8.deviceId,0,0x98);
      bVar5 = MountPoint::parse(&local_2d8,&local_340);
      if ((bVar5) && (local_2d8.fsType.len_ == 6)) {
        iVar6 = bcmp(local_2d8.fsType.str_,"cgroup",6);
        if ((iVar6 == 0) &&
           (local_2d8.superOptions.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_2d8.superOptions.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
            _M_impl.super__Vector_impl_data._M_start)) {
          lVar8 = 8;
          uVar9 = 0;
          do {
            lVar2 = *(long *)((long)&(local_2d8.superOptions.
                                      super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->str_ + lVar8);
            if (lVar2 == 0) {
              local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
              local_388._M_string_length = 0;
              local_388.field_2._M_local_buf[0] = '\0';
            }
            else {
              lVar3 = *(long *)((long)local_2d8.superOptions.
                                      super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar8 + -8);
              local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_388,lVar3,lVar2 + lVar3);
            }
            iVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>_>_>
                    ::find(local_368,&local_388);
            if (iVar7._M_node != local_320) {
              MountPoint::translate(&local_360,&local_2d8,(string *)&iVar7._M_node[2]._M_parent);
              if (local_360._M_string_length != 0) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                          (&local_318,&local_388,&local_360);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)__return_storage_ptr__,&local_318);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318.second._M_dataplus._M_p != &local_318.second.field_2) {
                  operator_delete(local_318.second._M_dataplus._M_p,
                                  local_318.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318.first._M_dataplus._M_p != &local_318.first.field_2) {
                  operator_delete(local_318.first._M_dataplus._M_p,
                                  local_318.first.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p != &local_360.field_2) {
                operator_delete(local_360._M_dataplus._M_p,
                                local_360.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_388._M_dataplus._M_p != &local_388.field_2) {
              operator_delete(local_388._M_dataplus._M_p,
                              CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                                       local_388.field_2._M_local_buf[0]) + 1);
            }
            uVar9 = uVar9 + 1;
            lVar8 = lVar8 + 0x10;
          } while (uVar9 < (ulong)((long)local_2d8.superOptions.
                                         super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_2d8.superOptions.
                                         super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
      }
      if (local_2d8.superOptions.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d8.superOptions.
                        super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2d8.superOptions.
                              super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d8.superOptions.
                              super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_2d8.optionalFields.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d8.optionalFields.
                        super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2d8.optionalFields.
                              super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d8.optionalFields.
                              super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_2d8.options.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d8.options.
                        super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2d8.options.
                              super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d8.options.
                              super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,
                        CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                                 local_340.field_2._M_local_buf[0]) + 1);
      }
    } while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0);
  }
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

map<string, string> ParseMountInfo(map<string, CGroupSubSys>& subsystems) {
  map<string, string> cgroups;
  ifstream mountinfo("/proc/self/mountinfo");
  if (!mountinfo.is_open())
    return cgroups;
  while (!mountinfo.eof()) {
    string line;
    getline(mountinfo, line);
    MountPoint mp;
    if (!mp.parse(line))
      continue;
    if (mp.fsType != "cgroup")
      continue;
    for (size_t i = 0; i < mp.superOptions.size(); i++) {
      string opt = mp.superOptions[i].AsString();
      map<string, CGroupSubSys>::iterator subsys = subsystems.find(opt);
      if (subsys == subsystems.end())
        continue;
      string newPath = mp.translate(subsys->second.name);
      if (!newPath.empty())
        cgroups.insert(make_pair(opt, newPath));
    }
  }
  return cgroups;
}